

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtmain.h
# Opt level: O0

Api find_audio_api(char *id)

{
  int iVar1;
  ulong local_20;
  size_t i;
  char *id_local;
  
  local_20 = 0;
  while( true ) {
    if (9 < local_20) {
      return UNSPECIFIED;
    }
    iVar1 = strcmp(id,audio_api_ids[local_20]);
    if (iVar1 == 0) break;
    local_20 = local_20 + 1;
  }
  return (Api)local_20;
}

Assistant:

inline RtAudio::Api find_audio_api(const char *id)
{
    for (size_t i = 0; i < audio_api_count; ++i)
        if (!strcmp(id, audio_api_ids[i]))
            return (RtAudio::Api)i;
    return RtAudio::UNSPECIFIED;
}